

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAcurv::ChNodeFEAcurv
          (ChNodeFEAcurv *this,ChVector<double> *rxx,ChVector<double> *ryy,ChVector<double> *rzz)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  ChVariablesGenericDiagonalMass *this_00;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0xf8);
  auVar6 = _DAT_00e94100;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0x117cba8;
  *(undefined8 *)&this->field_0xf8 = 0x117cd50;
  *(double *)&(this->super_ChNodeFEAbase).field_0x20 = rxx->m_data[0];
  *(double *)&this->field_0x28 = rxx->m_data[1];
  *(double *)&this->field_0x30 = rxx->m_data[2];
  (this->m_ryy).m_data[0] = ryy->m_data[0];
  (this->m_ryy).m_data[1] = ryy->m_data[1];
  (this->m_ryy).m_data[2] = ryy->m_data[2];
  (this->m_rzz).m_data[0] = rzz->m_data[0];
  (this->m_rzz).m_data[1] = rzz->m_data[1];
  auVar4 = _VNULL;
  auVar7 = ZEXT1664(_VNULL);
  auVar3 = vpermpd_avx2(ZEXT1632(_VNULL),0xd0);
  auVar3 = vblendpd_avx(auVar3,ZEXT832((ulong)rzz->m_data[2]),1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = DAT_011dd3e8;
  auVar5 = vbroadcastsd_avx512f(auVar2);
  auVar6 = vpermi2pd_avx512f(auVar6,ZEXT3264(auVar3),auVar5);
  *(undefined1 (*) [64])((this->m_rzz).m_data + 2) = auVar6;
  auVar6 = vpermi2pd_avx512f(_DAT_00e94140,auVar7,auVar5);
  *(undefined1 (*) [64])((this->m_rzz_dt).m_data + 1) = auVar6;
  *(undefined1 (*) [16])(this->m_rzz_dtdt).m_data = auVar4;
  dVar1 = (double)vmovlpd_avx(auVar5._0_16_);
  (this->m_rzz_dtdt).m_data[2] = dVar1;
  this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
  ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,9);
  *(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAbase).field_0x18 = this_00;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this_00->MmassDiag);
  return;
}

Assistant:

ChNodeFEAcurv::ChNodeFEAcurv(const ChVector<>& rxx, const ChVector<>& ryy, const ChVector<>& rzz)
    : m_rxx(rxx),
      m_ryy(ryy),
      m_rzz(rzz),
      m_rxx_dt(VNULL),
      m_ryy_dt(VNULL),
      m_rzz_dt(VNULL),
      m_rxx_dtdt(VNULL),
      m_ryy_dtdt(VNULL),
      m_rzz_dtdt(VNULL) {
    m_variables = new ChVariablesGenericDiagonalMass(9);
    m_variables->GetMassDiagonal().setZero();
}